

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Cte * searchWith(With *pWith,SrcList_item *pItem,With **ppContext)

{
  char *zLeft;
  int iVar1;
  int local_3c;
  With *pWStack_38;
  int i;
  With *p;
  char *zName;
  With **ppContext_local;
  SrcList_item *pItem_local;
  With *pWith_local;
  
  if ((pItem->zDatabase == (char *)0x0) &&
     (zLeft = pItem->zName, pWStack_38 = pWith, zLeft != (char *)0x0)) {
    for (; pWStack_38 != (With *)0x0; pWStack_38 = pWStack_38->pOuter) {
      for (local_3c = 0; local_3c < pWStack_38->nCte; local_3c = local_3c + 1) {
        iVar1 = sqlite3StrICmp(zLeft,pWStack_38->a[local_3c].zName);
        if (iVar1 == 0) {
          *ppContext = pWStack_38;
          return pWStack_38->a + local_3c;
        }
      }
    }
  }
  return (Cte *)0x0;
}

Assistant:

static struct Cte *searchWith(
  With *pWith,                    /* Current innermost WITH clause */
  struct SrcList_item *pItem,     /* FROM clause element to resolve */
  With **ppContext                /* OUT: WITH clause return value belongs to */
){
  const char *zName;
  if( pItem->zDatabase==0 && (zName = pItem->zName)!=0 ){
    With *p;
    for(p=pWith; p; p=p->pOuter){
      int i;
      for(i=0; i<p->nCte; i++){
        if( sqlite3StrICmp(zName, p->a[i].zName)==0 ){
          *ppContext = p;
          return &p->a[i];
        }
      }
    }
  }
  return 0;
}